

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void gai_FindOffset(Integer ndim,Integer *lo,Integer *plo,Integer *ld,Integer *offset)

{
  Integer factor;
  Integer i;
  Integer *offset_local;
  Integer *ld_local;
  Integer *plo_local;
  Integer *lo_local;
  Integer ndim_local;
  
  *offset = 0;
  factor = 1;
  for (i = 0; i < ndim; i = i + 1) {
    *offset = (plo[i] - lo[i]) * factor + *offset;
    if (i < ndim + -1) {
      factor = ld[i] * factor;
    }
  }
  return;
}

Assistant:

void  gai_FindOffset(Integer ndim,Integer *lo, Integer *plo,
    Integer *ld, Integer *offset)
{
  Integer i, factor;
  *offset = 0;
  factor = 1;
  for (i=0; i<ndim; i++) {
    *offset += (plo[i]-lo[i])*factor; 
    if (i<ndim-1) factor *= ld[i];
  }
}